

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

FunctionPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPrototypeSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::NameSyntax&,slang::syntax::FunctionPortListSyntax*&>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ClassSpecifierSyntax> *args_1,
          Token *args_2,DataTypeSyntax *args_3,NameSyntax *args_4,FunctionPortListSyntax **args_5)

{
  Token lifetime;
  Token keyword;
  FunctionPrototypeSyntax *this_00;
  
  this_00 = (FunctionPrototypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionPrototypeSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (FunctionPrototypeSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  lifetime.kind = args_2->kind;
  lifetime._2_1_ = args_2->field_0x2;
  lifetime.numFlags.raw = (args_2->numFlags).raw;
  lifetime.rawLen = args_2->rawLen;
  lifetime.info = args_2->info;
  slang::syntax::FunctionPrototypeSyntax::FunctionPrototypeSyntax
            (this_00,keyword,args_1,lifetime,args_3,args_4,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }